

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
          (UserDefinedIOCase *this,Context *context,char *name,char *description,
          TessPrimitiveType primType,IOType ioType,VertexIOArraySize vertexIOArraySize,
          TessControlOutArraySize tessControlOutArraySize,char *referenceImagePath)

{
  undefined4 in_stack_00000014;
  allocator<char> local_31;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,SSBOArrayLengthTests::init::arraysSized + 1);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UserDefinedIOCase_00b479e0;
  this->m_primitiveType = (TessPrimitiveType)description;
  this->m_ioType = primType;
  this->m_vertexIOArraySize = ioType;
  this->m_tessControlOutArraySize = vertexIOArraySize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_referenceImagePath,
             (char *)CONCAT44(in_stack_00000014,tessControlOutArraySize),&local_31);
  (this->m_tesInputs).
  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_program).m_ptr = (ShaderProgram *)0x0;
  (this->m_tesInputs).
  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tesInputs).
  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tcsOutputs).
  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tcsOutputs).
  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structTypes).super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tcsOutputs).
  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_program).m_state = (SharedPtrStateBase *)0x0;
  return;
}

Assistant:

UserDefinedIOCase (Context& context, const char* name, const char* description, TessPrimitiveType primType, IOType ioType, VertexIOArraySize vertexIOArraySize, TessControlOutArraySize tessControlOutArraySize, const char* referenceImagePath)
		: TestCase					(context, name, description)
		, m_primitiveType			(primType)
		, m_ioType					(ioType)
		, m_vertexIOArraySize		(vertexIOArraySize)
		, m_tessControlOutArraySize	(tessControlOutArraySize)
		, m_referenceImagePath		(referenceImagePath)
	{
	}